

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTableInit
          (SharedValidator *this,Location *loc,Var *segment_var,Var *table_var)

{
  Result RVar1;
  char *pcVar2;
  char *pcVar3;
  int __c;
  int __c_00;
  Var local_108;
  Enum local_bc;
  Var local_b8;
  Enum local_70;
  undefined1 local_6c [8];
  ElemType elem_type;
  TableType table_type;
  Var *table_var_local;
  Var *segment_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&table_type.limits.field_0x14,TableInit);
  this_local._4_4_ = CheckInstr(this,(Opcode)table_type.limits._20_4_,loc);
  TableType::TableType((TableType *)&elem_type.table_type);
  Var::Var(&local_b8,table_var);
  local_70 = (Enum)CheckTableIndex(this,&local_b8,(TableType *)&elem_type.table_type);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_70);
  Var::~Var(&local_b8);
  Var::Var(&local_108,segment_var);
  local_bc = (Enum)CheckElemSegmentIndex(this,&local_108,(ElemType *)local_6c);
  pcVar3 = (char *)(ulong)local_bc;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_bc);
  Var::~Var(&local_108);
  pcVar2 = Var::index(table_var,pcVar3,__c);
  pcVar3 = Var::index(segment_var,pcVar3,__c_00);
  RVar1 = TypeChecker::OnTableInit(&this->typechecker_,(uint32_t)pcVar2,(uint32_t)pcVar3);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = CheckType(this,loc,(Type)local_6c,elem_type.table_type,"table.init");
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTableInit(const Location& loc,
                                    Var segment_var,
                                    Var table_var) {
  Result result = CheckInstr(Opcode::TableInit, loc);
  TableType table_type;
  ElemType elem_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= CheckElemSegmentIndex(segment_var, &elem_type);
  result |= typechecker_.OnTableInit(table_var.index(), segment_var.index());
  result |= CheckType(loc, elem_type.element, table_type.element, "table.init");
  return result;
}